

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fpassthru(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  io_private *pDev_00;
  char *pcVar2;
  jx9_int64 jVar3;
  char local_2048 [4];
  int rc;
  char zBuf [8192];
  jx9_int64 nRead;
  jx9_int64 n;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
  }
  else {
    pDev_00 = (io_private *)jx9_value_to_resource(*apArg);
    if ((pDev_00 == (io_private *)0x0) || (pDev_00->iMagic != 0xfeac14)) {
      jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
      jx9_result_bool(pCtx,0);
    }
    else if (pDev_00->pStream == (jx9_io_stream *)0x0) {
      pcVar2 = jx9_function_name(pCtx);
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,pcVar2,"null_stream");
      jx9_result_bool(pCtx,0);
    }
    else {
      zBuf[0x1ff8] = '\0';
      zBuf[0x1ff9] = '\0';
      zBuf[0x1ffa] = '\0';
      zBuf[0x1ffb] = '\0';
      zBuf[0x1ffc] = '\0';
      zBuf[0x1ffd] = '\0';
      zBuf[0x1ffe] = '\0';
      zBuf[0x1fff] = '\0';
      do {
        jVar3 = StreamRead(pDev_00,local_2048,0x2000);
        if (jVar3 < 1) break;
        zBuf._8184_8_ = jVar3 + zBuf._8184_8_;
        iVar1 = jx9_context_output(pCtx,local_2048,(int)zBuf._8184_8_);
      } while (iVar1 != -10);
      jx9_result_int64(pCtx,zBuf._8184_8_);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fpassthru(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 n, nRead;
	char zBuf[8192];
	int rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = StreamRead(pDev, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* Error or EOF */
			break;
		}
		/* Increment the read counter */
		nRead += n;
		/* Output data */
		rc = jx9_context_output(pCtx, zBuf, (int)nRead /* FIXME: 64-bit issues */);
		if( rc == JX9_ABORT ){
			/* Consumer callback request an operation abort */
			break;
		}
	}
	/* Total number of bytes readen */
	jx9_result_int64(pCtx, nRead);
	return JX9_OK;
}